

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O0

Element __thiscall ui::anon_unknown_1::PanelAdapter::Render(PanelAdapter *this)

{
  initializer_list<std::shared_ptr<ftxui::Node>_> __l;
  element_type *peVar1;
  element_type *peVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  Element EVar3;
  shared_ptr<ftxui::Node> *local_138;
  Decorator local_f0;
  allocator<std::shared_ptr<ftxui::Node>_> local_ca;
  undefined1 local_c9;
  Decorator local_c8;
  Element local_a8 [2];
  ftxui *local_88;
  undefined1 local_80 [48];
  shared_ptr<ftxui::Node> local_50;
  vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_> local_40;
  Element local_28;
  PanelAdapter *this_local;
  
  local_c9 = 1;
  local_88 = (ftxui *)local_80;
  this_local = this;
  peVar1 = std::__shared_ptr_access<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ftxui::ComponentBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)(in_RSI + 0x28));
  (*peVar1->_vptr_ComponentBase[2])(local_80);
  local_88 = (ftxui *)(local_80 + 0x10);
  ftxui::separator();
  local_88 = (ftxui *)(local_80 + 0x20);
  peVar2 = std::__shared_ptr_access<ui::PanelBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<ui::PanelBase,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)(in_RSI + 0x38));
  (*(peVar2->super_ComponentBase)._vptr_ComponentBase[2])(local_a8);
  std::function<std::shared_ptr<ftxui::Node>(std::shared_ptr<ftxui::Node>)>::
  function<std::shared_ptr<ftxui::Node>(&)(std::shared_ptr<ftxui::Node>),void>
            ((function<std::shared_ptr<ftxui::Node>(std::shared_ptr<ftxui::Node>)> *)&local_c8,
             ftxui::flex);
  ftxui::operator|((ftxui *)(local_80 + 0x20),local_a8,&local_c8);
  local_c9 = 0;
  local_50.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_80;
  local_50.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x3;
  std::allocator<std::shared_ptr<ftxui::Node>_>::allocator(&local_ca);
  __l._M_len = (size_type)
               local_50.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi;
  __l._M_array = (iterator)
                 local_50.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::vector
            (&local_40,__l,&local_ca);
  ftxui::vbox((ftxui *)&local_28,&local_40);
  std::function<std::shared_ptr<ftxui::Node>(std::shared_ptr<ftxui::Node>)>::
  function<std::shared_ptr<ftxui::Node>(&)(std::shared_ptr<ftxui::Node>),void>
            ((function<std::shared_ptr<ftxui::Node>(std::shared_ptr<ftxui::Node>)> *)&local_f0,
             ftxui::flex);
  ftxui::operator|((ftxui *)this,&local_28,&local_f0);
  std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::~function(&local_f0);
  std::shared_ptr<ftxui::Node>::~shared_ptr(&local_28);
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_40);
  std::allocator<std::shared_ptr<ftxui::Node>_>::~allocator(&local_ca);
  local_138 = &local_50;
  do {
    local_138 = local_138 + -1;
    std::shared_ptr<ftxui::Node>::~shared_ptr(local_138);
  } while (local_138 != (shared_ptr<ftxui::Node> *)local_80);
  std::function<std::shared_ptr<ftxui::Node>_(std::shared_ptr<ftxui::Node>)>::~function(&local_c8);
  std::shared_ptr<ftxui::Node>::~shared_ptr(local_a8);
  EVar3.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  EVar3.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar3.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element Render() final {
    return vbox({
               title_->Render(),
               separator(),
               panel_->Render() | flex,
           }) |
           flex;
  }